

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_moveOperandToCallArgumentVector
               (sysbvm_bytecodeJit_t *jit,int16_t operand,int32_t callArgumentVectorIndex)

{
  int offset;
  int offset_00;
  sysbvm_x86_register_t scratchRegister;
  int32_t vectorOffset;
  int16_t vectorIndex;
  sysbvm_operandVectorName_t vectorType;
  int32_t callArgumentVectorOffset;
  int32_t callArgumentVectorIndex_local;
  int16_t operand_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  if (0xf < callArgumentVectorIndex) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecodeJitX86.c:1209: assertion failure: callArgumentVectorIndex < SYSBVM_BYTECODE_FUNCTION_MAX_CALL_ARGUMENTS"
              );
  }
  offset = jit->callArgumentVectorOffset + callArgumentVectorIndex * 8;
  if (operand >> 2 < 0) {
    sysbvm_jit_x86_movS32IntoMemoryWithOffset(jit,SYSBVM_X86_EBP,offset,0);
  }
  else {
    offset_00 = (operand >> 2) * 8;
    switch(operand & 3) {
    case 0:
      sysbvm_jit_x86_mov64FromMemoryWithOffset
                (jit,SYSBVM_X86_64_CALL_SHADOW_SPACE,SYSBVM_X86_EBP,jit->argumentVectorOffset);
      sysbvm_jit_x86_mov64FromMemoryWithOffset
                (jit,SYSBVM_X86_64_CALL_SHADOW_SPACE,SYSBVM_X86_64_CALL_SHADOW_SPACE,offset_00);
      break;
    case 1:
      sysbvm_jit_x86_mov64FromMemoryWithOffset
                (jit,SYSBVM_X86_64_CALL_SHADOW_SPACE,SYSBVM_X86_EBP,jit->captureVectorOffset);
      sysbvm_jit_x86_mov64FromMemoryWithOffset
                (jit,SYSBVM_X86_64_CALL_SHADOW_SPACE,SYSBVM_X86_64_CALL_SHADOW_SPACE,
                 offset_00 + 0x10);
      break;
    case 2:
      sysbvm_jit_x86_mov64FromMemoryWithOffset
                (jit,SYSBVM_X86_64_CALL_SHADOW_SPACE,SYSBVM_X86_EBP,jit->literalVectorOffset);
      sysbvm_jit_x86_mov64FromMemoryWithOffset
                (jit,SYSBVM_X86_64_CALL_SHADOW_SPACE,SYSBVM_X86_64_CALL_SHADOW_SPACE,
                 offset_00 + 0x10);
      break;
    case 3:
      sysbvm_jit_x86_mov64FromMemoryWithOffset
                (jit,SYSBVM_X86_64_CALL_SHADOW_SPACE,SYSBVM_X86_EBP,
                 jit->localVectorOffset + offset_00);
    }
    sysbvm_jit_x86_mov64IntoMemoryWithOffset
              (jit,SYSBVM_X86_EBP,offset,SYSBVM_X86_64_CALL_SHADOW_SPACE);
  }
  return;
}

Assistant:

static void sysbvm_jit_moveOperandToCallArgumentVector(sysbvm_bytecodeJit_t *jit, int16_t operand, int32_t callArgumentVectorIndex)
{
    SYSBVM_ASSERT(callArgumentVectorIndex < SYSBVM_BYTECODE_FUNCTION_MAX_CALL_ARGUMENTS);
    int32_t callArgumentVectorOffset = jit->callArgumentVectorOffset + callArgumentVectorIndex * sizeof(void*);
    sysbvm_operandVectorName_t vectorType = (sysbvm_operandVectorName_t) (operand & SYSBVM_OPERAND_VECTOR_BITMASK);
    int16_t vectorIndex = operand >> SYSBVM_OPERAND_VECTOR_BITS;
    if(vectorIndex < 0)
    {
        sysbvm_jit_x86_movS32IntoMemoryWithOffset(jit, SYSBVM_X86_RBP, callArgumentVectorOffset, 0);
        return;
    }

    int32_t vectorOffset = vectorIndex * sizeof(void*);
    sysbvm_x86_register_t scratchRegister = SYSBVM_X86_RAX;
    switch(vectorType)
    {
    case SYSBVM_OPERAND_VECTOR_ARGUMENTS:
        sysbvm_jit_x86_mov64FromMemoryWithOffset(jit, scratchRegister, SYSBVM_X86_RBP, jit->argumentVectorOffset);
        sysbvm_jit_x86_mov64FromMemoryWithOffset(jit, scratchRegister, scratchRegister, vectorOffset);
        break;
    case SYSBVM_OPERAND_VECTOR_CAPTURES:
        sysbvm_jit_x86_mov64FromMemoryWithOffset(jit, scratchRegister, SYSBVM_X86_RBP, jit->captureVectorOffset);
        sysbvm_jit_x86_mov64FromMemoryWithOffset(jit, scratchRegister, scratchRegister, sizeof(sysbvm_tuple_header_t) + vectorOffset);
        break;
    case SYSBVM_OPERAND_VECTOR_LITERAL:
        sysbvm_jit_x86_mov64FromMemoryWithOffset(jit, scratchRegister, SYSBVM_X86_RBP, jit->literalVectorOffset);
        sysbvm_jit_x86_mov64FromMemoryWithOffset(jit, scratchRegister, scratchRegister, sizeof(sysbvm_tuple_header_t) + vectorOffset);
        break;
    case SYSBVM_OPERAND_VECTOR_LOCAL:
        sysbvm_jit_x86_mov64FromMemoryWithOffset(jit, scratchRegister, SYSBVM_X86_RBP, jit->localVectorOffset + vectorOffset);
        break;
    }

    sysbvm_jit_x86_mov64IntoMemoryWithOffset(jit, SYSBVM_X86_RBP, callArgumentVectorOffset, scratchRegister);
}